

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

void __thiscall Connection::exchange_data(Connection *this,fd_set *rdfds,fd_set *wrfds)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  
  if ((this->data_c_f_ == 0) &&
     (iVar1 = this->client_socket_,
     ((ulong)rdfds->fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) != 0)) {
    sVar2 = recv(iVar1,(this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,this->kBufSize,0);
    this->data_c_f_ = sVar2;
    if (sVar2 == 0) {
LAB_00103bbd:
      this->active_ = false;
    }
    else if (sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) goto LAB_00103bbd;
      this->data_c_f_ = 0;
    }
  }
  if ((this->data_f_c_ != 0) ||
     (iVar1 = this->forwarding_socket_,
     ((ulong)rdfds->fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) == 0))
  goto LAB_00103a73;
  sVar2 = recv(iVar1,(this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start,this->kBufSize,0);
  this->data_f_c_ = sVar2;
  if (sVar2 != 0) {
    if (sVar2 != -1) goto LAB_00103a73;
    piVar3 = __errno_location();
    if (*piVar3 == 0xb) {
      this->data_f_c_ = 0;
      goto LAB_00103a73;
    }
  }
  this->active_ = false;
LAB_00103a73:
  if ((0 < this->data_c_f_) &&
     (iVar1 = this->forwarding_socket_,
     ((ulong)wrfds->fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) != 0)) {
    sVar2 = send(iVar1,(this->buf_cf_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,this->data_c_f_,0);
    if (sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) {
        this->active_ = false;
      }
    }
    else {
      this->data_c_f_ = 0;
    }
  }
  if ((0 < this->data_f_c_) &&
     (iVar1 = this->client_socket_,
     ((ulong)wrfds->fds_bits[iVar1 / 0x40] >> ((long)iVar1 % 0x40 & 0x3fU) & 1) != 0)) {
    sVar2 = send(iVar1,(this->buf_fc_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,this->data_f_c_,0);
    if (sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 0xb) {
        this->active_ = false;
      }
    }
    else {
      this->data_f_c_ = 0;
    }
  }
  return;
}

Assistant:

void Connection::exchange_data(const fd_set &rdfds, const fd_set &wrfds) {
    if (data_c_f_ == 0 && FD_ISSET(client_socket_, &rdfds)) {
        data_c_f_ = ::recv(client_socket_, &buf_cf_[0], kBufSize, 0);
        if (data_c_f_ == 0 || (data_c_f_ == -1 && errno != EWOULDBLOCK)) {
            active_ = false;
        }
        if (data_c_f_ == -1 && errno == EWOULDBLOCK) {
            data_c_f_ = 0;
        }
    }
    if (data_f_c_ == 0 && FD_ISSET(forwarding_socket_, &rdfds)) {
        data_f_c_ = ::recv(forwarding_socket_, &buf_fc_[0], kBufSize, 0);
        if (data_f_c_ == 0 || (data_f_c_ == -1 && errno != EWOULDBLOCK)) {
            active_ = false;
        }
        if (data_f_c_ == -1 && errno == EWOULDBLOCK) {
            data_f_c_ = 0;
        }
    }
    if (data_c_f_ > 0 && FD_ISSET(forwarding_socket_, &wrfds)) {
        ssize_t res = send(forwarding_socket_, &buf_cf_[0], data_c_f_, 0);
        if (res == -1) {
            if (errno != EWOULDBLOCK) {
                active_ = false;
            }
        } else data_c_f_ = 0;
    }
    if (data_f_c_ > 0 && FD_ISSET(client_socket_, &wrfds)) {
        ssize_t res = send(client_socket_, &buf_fc_[0], data_f_c_, 0);
        if (res == -1) {
            if (errno != EWOULDBLOCK) {
                active_ = false;
            }
        } else data_f_c_ = 0;
    }

}